

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  Nf_Man_t *p_00;
  abctime aVar2;
  Nf_Obj_t *pNVar3;
  Vec_Int_t *vRefs;
  Mio_Library_t *pLib;
  Nf_Mat_t *pNVar4;
  int local_2c;
  int Entry;
  int i;
  Nf_Man_t *p;
  Vec_Int_t *vFlowRefs;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if ((pPars->nCutNum < 2) || (0x20 < pPars->nCutNum)) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x172,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if ((1 < pPars->nLutSize) && (pPars->nLutSize < 7)) {
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Vec_IntFreeP(&pGia->vCellMapping);
    iVar1 = Gia_ManHasChoices(pGia);
    if (iVar1 != 0) {
      Gia_ManSetPhase(pGia);
    }
    p_00 = (Nf_Man_t *)calloc(1,0x120);
    aVar2 = Abc_Clock();
    p_00->clkStart = aVar2;
    p_00->pGia = pGia;
    p_00->pPars = pPars;
    iVar1 = Gia_ManObjNum(pGia);
    pNVar3 = (Nf_Obj_t *)calloc((long)iVar1,0x40);
    p_00->pNfObjs = pNVar3;
    p_00->iCur = 2;
    Vec_PtrGrow(&p_00->vPages,0x100);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vMapRefs,iVar1 << 1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_FltFill(&p_00->vFlowRefs,iVar1 << 1,0.0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vRequired,iVar1 << 1,0x3fffffff);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vCutSets,iVar1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_FltFill(&p_00->vCutFlows,iVar1,0.0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vCutDelays,iVar1,0);
    Vec_IntGrow(&p_00->vBackup,1000);
    vRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs(pGia,vRefs);
    for (local_2c = 0; iVar1 = Vec_IntSize(vRefs), local_2c < iVar1; local_2c = local_2c + 1) {
      iVar1 = Vec_IntEntry(vRefs,local_2c);
      Vec_FltWriteEntry(&p_00->vFlowRefs,local_2c << 1,(float)iVar1);
      Vec_FltWriteEntry(&p_00->vFlowRefs,local_2c * 2 + 1,(float)iVar1);
    }
    Vec_IntFree(vRefs);
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_LibraryMatchesFetch
              (pLib,&p_00->vTtMem,&p_00->vTt2Match,&p_00->pCells,&p_00->nCells,
               p_00->pPars->fPinFilter,p_00->pPars->fPinPerm,p_00->pPars->fPinQuick);
    p_00->InvDelayI = p_00->pCells[3].iDelays[0];
    p_00->InvAreaW = p_00->pCells[3].AreaW;
    p_00->InvAreaF = p_00->pCells[3].AreaF;
    pNVar4 = Nf_ObjMatchD(p_00,0,0);
    *(uint *)pNVar4 = *(uint *)pNVar4 & 0xfff00000;
    pNVar4 = Nf_ObjMatchD(p_00,0,1);
    *(uint *)pNVar4 = *(uint *)pNVar4 & 0xfff00000 | 1;
    return p_00;
  }
  __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                ,0x173,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_IntFill( &p->vRequired, 2*Gia_ManObjNum(pGia), SCL_INFINITY ); // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    Mio_LibraryMatchesFetch( (Mio_Library_t *)Abc_FrameReadLibGen(), &p->vTtMem, &p->vTt2Match, &p->pCells, &p->nCells, p->pPars->fPinFilter, p->pPars->fPinPerm, p->pPars->fPinQuick );
    p->InvDelayI = p->pCells[3].iDelays[0];
    p->InvAreaW  = p->pCells[3].AreaW;
    p->InvAreaF  = p->pCells[3].AreaF;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}